

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftEa<(moira::Core)2,(moira::Instr)10,(moira::Mode)5,2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 val;
  uint local_20;
  u32 local_1c;
  u32 data;
  u32 ea;
  int src;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  data = opcode & 7;
  ea._2_2_ = opcode;
  _src = this;
  readOp<(moira::Core)2,(moira::Mode)5,2,128ull>(this,data,&local_1c,&local_20);
  bVar1 = looping<(moira::Instr)10>(this);
  if (bVar1) {
    noPrefetch<(moira::Core)2>(this,4);
  }
  else {
    prefetch<(moira::Core)2,4ull>(this);
  }
  val = shift<(moira::Core)2,(moira::Instr)10,2>(this,1,(ulong)local_20);
  writeM<(moira::Core)2,(moira::Mode)5,2,0ull>(this,local_1c,val);
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0xb));
  return;
}

Assistant:

void
Moira::execShiftEa(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = _____________xxx(opcode);

    u32 ea, data;
    readOp<C, M, S, STD_AE_FRAME>(src, &ea, &data);

    looping<I>() ? noPrefetch<C>(4) : prefetch<C, POLL>();
    writeM<C, M, S>(ea, shift<C, I, S>(1, data));

    if constexpr (I == Instr::ROR || I == Instr::ROL) {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0,  0,       12, 12, 11,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,       12, 12, 11,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,       14, 14, 12,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,       16, 16, 12,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,       18, 18, 14,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,       16, 16, 11,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,       20, 20, 11,        0,  0,  0)

    } else if constexpr (I == Instr::ASL) {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0,  0,       12, 12, 10,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,       12, 12, 10,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,       14, 14, 11,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,       16, 16, 11,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,       18, 18, 13,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,       16, 16, 10,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,       20, 20, 10,        0,  0,  0)

    } else {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0,  0,       12, 12,  9,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,       12, 12,  9,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,       14, 14, 10,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,       16, 16, 10,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,       18, 18, 12,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,       16, 16,  9,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,       20, 20,  9,        0,  0,  0)
    }

    FINALIZE
}